

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

pair<cmQtAutoGen::IntegerVersion,_unsigned_int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget *target)

{
  pointer pIVar1;
  bool bVar2;
  char *pcVar3;
  cmMakefile *this;
  char *pcVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  IntegerVersion IVar9;
  long lVar10;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> pVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> knownQtVersions;
  IntegerVersion local_a8;
  string local_a0;
  string local_80;
  uint local_5c;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> local_58;
  cmMakefile *local_38;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"QT_MAJOR_VERSION","");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  pcVar3 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty(target,&local_a0,&local_80);
  local_58.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uVar7 = 0;
  if ((pcVar3 != (char *)0x0) &&
     (bVar2 = cmSystemTools::StringToULong(pcVar3,(unsigned_long *)&local_58), uVar7 = 0, bVar2)) {
    uVar7 = (uint)local_58.
                  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ == '\0') {
    GetQtVersion();
  }
  local_58.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::reserve
            (&local_58,6);
  local_5c = uVar7;
  this = cmTarget::GetMakefile(target->Target);
  lVar10 = 8;
  local_38 = this;
  do {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,*(long *)((long)&GetParallelCPUCount()::count + lVar10),
               *(long *)((long)&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ +
                        lVar10) + *(long *)((long)&GetParallelCPUCount()::count + lVar10));
    std::__cxx11::string::append((char *)&local_a0);
    pcVar3 = cmMakefile::GetDefinition(this,&local_a0);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,*(long *)((long)&GetParallelCPUCount()::count + lVar10),
               *(long *)((long)&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ +
                        lVar10) + *(long *)((long)&GetParallelCPUCount()::count + lVar10));
    std::__cxx11::string::append((char *)&local_80);
    pcVar4 = cmMakefile::GetDefinition(this,&local_80);
    local_a8.Major = 0;
    local_a8.Minor = 0;
    uVar7 = 0;
    if (pcVar3 != (char *)0x0) {
      bVar2 = cmSystemTools::StringToULong(pcVar3,(unsigned_long *)&local_a8);
      uVar7 = 0;
      if (bVar2) {
        uVar7 = local_a8.Major;
      }
    }
    local_a8.Major = 0;
    local_a8.Minor = 0;
    uVar8 = 0;
    if ((pcVar4 != (char *)0x0) &&
       (bVar2 = cmSystemTools::StringToULong(pcVar4,(unsigned_long *)&local_a8), uVar8 = 0, bVar2))
    {
      uVar8 = local_a8.Major;
    }
    local_a8.Minor = uVar8;
    local_a8.Major = uVar7;
    if (uVar7 != 0) {
      std::vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>>::
      emplace_back<cmQtAutoGen::IntegerVersion&>
                ((vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>> *)
                 &local_58,&local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    this = local_38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x68);
  lVar10 = 8;
  do {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,*(long *)((long)&GetParallelCPUCount()::count + lVar10),
               *(long *)((long)&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ +
                        lVar10) + *(long *)((long)&GetParallelCPUCount()::count + lVar10));
    std::__cxx11::string::append((char *)&local_a0);
    pcVar3 = cmMakefile::GetProperty(this,&local_a0);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,*(long *)((long)&GetParallelCPUCount()::count + lVar10),
               *(long *)((long)&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ +
                        lVar10) + *(long *)((long)&GetParallelCPUCount()::count + lVar10));
    std::__cxx11::string::append((char *)&local_80);
    pcVar4 = cmMakefile::GetProperty(this,&local_80);
    local_a8.Major = 0;
    local_a8.Minor = 0;
    uVar7 = 0;
    if (pcVar3 != (char *)0x0) {
      bVar2 = cmSystemTools::StringToULong(pcVar3,(unsigned_long *)&local_a8);
      uVar7 = 0;
      if (bVar2) {
        uVar7 = local_a8.Major;
      }
    }
    local_a8.Major = 0;
    local_a8.Minor = 0;
    uVar8 = 0;
    if ((pcVar4 != (char *)0x0) &&
       (bVar2 = cmSystemTools::StringToULong(pcVar4,(unsigned_long *)&local_a8), uVar8 = 0, bVar2))
    {
      uVar8 = local_a8.Major;
    }
    local_a8.Minor = uVar8;
    local_a8.Major = uVar7;
    if (uVar7 != 0) {
      std::vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>>::
      emplace_back<cmQtAutoGen::IntegerVersion&>
                ((vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>> *)
                 &local_58,&local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    this = local_38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_5c;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x68);
  uVar6 = 0;
  if (local_58.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_58.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    IVar9.Major = 0;
    IVar9.Minor = 0;
  }
  else {
    pIVar1 = local_58.
             super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_5c == 0) {
      if (local_58.
          super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_58.
          super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar5 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
        if (local_58.
            super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.
                          super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.
                                super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.
                                super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar5);
      }
      IVar9 = *local_58.
               super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (ulong)IVar9 >> 0x20;
    }
    else {
      for (; pIVar1 != local_58.
                       super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pIVar1 = pIVar1 + 1) {
        IVar9.Minor = 0;
        IVar9.Major = pIVar1->Major;
        if (pIVar1->Major == local_5c) {
          uVar6 = (ulong)pIVar1->Minor;
          goto LAB_003405e4;
        }
      }
      IVar9.Major = 0;
      IVar9.Minor = 0;
    }
  }
LAB_003405e4:
  if (local_58.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVar11.first = (IntegerVersion)((ulong)IVar9 & 0xffffffff | uVar6 << 0x20);
  pVar11.second = uVar7;
  return pVar11;
}

Assistant:

std::pair<cmQtAutoGen::IntegerVersion, unsigned int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget const* target)
{
  std::pair<IntegerVersion, unsigned int> res(
    IntegerVersion(),
    CharPtrToUInt(target->GetLinkInterfaceDependentStringProperty(
      "QT_MAJOR_VERSION", "")));

  auto knownQtVersions = GetKnownQtVersions(target);
  if (!knownQtVersions.empty()) {
    if (res.second == 0) {
      // No specific version was requested by the target:
      // Use highest known Qt version.
      res.first = knownQtVersions.at(0);
    } else {
      // Pick a version from the known versions:
      for (auto it : knownQtVersions) {
        if (it.Major == res.second) {
          res.first = it;
          break;
        }
      }
    }
  }
  return res;
}